

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCrewResource::IfcCrewResource(IfcCrewResource *this)

{
  *(undefined ***)&(this->super_IfcConstructionResource).field_0x188 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x190 = 0;
  *(char **)&this->field_0x198 = "IfcCrewResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__007a6190);
  *(undefined8 *)&this->super_IfcConstructionResource = 0x7a6088;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x188 = 0x7a6178;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x7a60b0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x7a60d8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x7a6100;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x7a6128;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x7a6150;
  return;
}

Assistant:

IfcCrewResource() : Object("IfcCrewResource") {}